

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O0

REF_STATUS
ref_inflate_interpolate_rail
          (REF_INT n,REF_DBL *x,REF_DBL *yz,REF_DBL *phi,REF_DBL xold,REF_DBL *newyz,REF_DBL *newphi
          )

{
  uint uVar1;
  double dVar2;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_68;
  double dStack_58;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL t1;
  REF_DBL t0;
  REF_INT i1;
  REF_INT i0;
  REF_DBL *newphi_local;
  REF_DBL *newyz_local;
  REF_DBL xold_local;
  REF_DBL *phi_local;
  REF_DBL *yz_local;
  REF_DBL *x_local;
  REF_INT n_local;
  
  _i1 = newphi;
  newphi_local = newyz;
  newyz_local = (REF_DBL *)xold;
  xold_local = (REF_DBL)phi;
  phi_local = yz;
  yz_local = x;
  x_local._0_4_ = n;
  if ((xold < *x) || (x[n + -1] < xold)) {
    printf("x range %f %f %f\n",*x,xold,x[n + -1]);
  }
  uVar1 = ref_sort_search_dbl((REF_INT)x_local,yz_local,(REF_DBL)newyz_local,
                              (REF_INT *)((long)&t0 + 4));
  if (uVar1 == 0) {
    t0._0_4_ = t0._4_4_ + 1;
    dStack_58 = 0.0;
    if ((yz_local[t0._0_4_] - yz_local[t0._4_4_]) * 1e+20 <= 0.0) {
      local_68 = -((yz_local[t0._0_4_] - yz_local[t0._4_4_]) * 1e+20);
    }
    else {
      local_68 = (yz_local[t0._0_4_] - yz_local[t0._4_4_]) * 1e+20;
    }
    if ((double)newyz_local - yz_local[t0._4_4_] <= 0.0) {
      local_78 = -((double)newyz_local - yz_local[t0._4_4_]);
    }
    else {
      local_78 = (double)newyz_local - yz_local[t0._4_4_];
    }
    if (local_78 < local_68) {
      dStack_58 = ((double)newyz_local - yz_local[t0._4_4_]) /
                  (yz_local[t0._0_4_] - yz_local[t0._4_4_]);
    }
    if (0.0 <= dStack_58) {
      local_80 = dStack_58;
    }
    else {
      local_80 = 0.0;
    }
    if (1.0 <= local_80) {
      local_90 = 1.0;
    }
    else {
      if (0.0 <= dStack_58) {
        local_88 = dStack_58;
      }
      else {
        local_88 = 0.0;
      }
      local_90 = local_88;
    }
    dVar2 = 1.0 - local_90;
    *newphi_local = dVar2 * phi_local[t0._4_4_ << 1] + local_90 * phi_local[t0._0_4_ * 2];
    newphi_local[1] = dVar2 * phi_local[t0._4_4_ * 2 + 1] + local_90 * phi_local[t0._0_4_ * 2 + 1];
    *_i1 = dVar2 * *(double *)((long)xold_local + (long)t0._4_4_ * 8) +
           local_90 * *(double *)((long)xold_local + (long)t0._0_4_ * 8);
    if (((double)newyz_local < *yz_local) || (yz_local[(REF_INT)x_local + -1] < (double)newyz_local)
       ) {
      printf("extrap %f %f %f\n",
             (double)newyz_local - (dVar2 * yz_local[t0._4_4_] + local_90 * yz_local[t0._0_4_]),
             newyz_local,dVar2 * yz_local[t0._4_4_] + local_90 * yz_local[t0._0_4_]);
    }
    x_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x221
           ,"ref_inflate_interpolate_rail",(ulong)uVar1,"rail i0");
    x_local._4_4_ = uVar1;
  }
  return x_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_inflate_interpolate_rail(
    REF_INT n, REF_DBL *x, REF_DBL *yz, REF_DBL *phi, REF_DBL xold,
    REF_DBL *newyz, REF_DBL *newphi) {
  REF_INT i0, i1;
  REF_DBL t0, t1;
  if (xold < x[0] || x[n - 1] < xold)
    printf("x range %f %f %f\n", x[0], xold, x[n - 1]);
  RSS(ref_sort_search_dbl(n, x, xold, &i0), "rail i0");
  i1 = i0 + 1;
  t1 = 0.0;
  if (ref_math_divisible((xold - x[i0]), (x[i1] - x[i0]))) {
    t1 = (xold - x[i0]) / (x[i1] - x[i0]);
  }
  t1 = MIN(MAX(0.0, t1), 1.0);
  t0 = 1.0 - t1;
  newyz[0] = t0 * yz[0 + 2 * i0] + t1 * yz[0 + 2 * i1];
  newyz[1] = t0 * yz[1 + 2 * i0] + t1 * yz[1 + 2 * i1];
  *newphi = t0 * phi[i0] + t1 * phi[i1];

  if (xold < x[0] || x[(n)-1] < xold)
    printf("extrap %f %f %f\n", xold - (t0 * x[i0] + t1 * x[i1]), xold,
           (t0 * x[i0] + t1 * x[i1]));

  return REF_SUCCESS;
}